

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

bool __thiscall Parsing::File::createFile(File *this)

{
  int iVar1;
  bool bVar2;
  ofstream f;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  bVar2 = false;
  iVar1 = access((this->_path)._M_dataplus._M_p,0);
  if (iVar1 == -1) {
    std::ofstream::ofstream((ofstream *)&local_210,(string *)&this->_path,_S_out);
    std::ofstream::close();
    iVar1 = access((this->_path)._M_dataplus._M_p,0);
    bVar2 = iVar1 != -1;
    local_210 = _VTT;
    *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_208);
    std::ios_base::~ios_base(local_118);
  }
  return bVar2;
}

Assistant:

bool File::createFile() const noexcept
    {
        if (isFile())
            return false;

        std::ofstream f(_path);
        f.close();

        if (!isFile())
            return false;

        return true;
    }